

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O1

bool kj::_::hasSubstring(StringPtr haystack,StringPtr needle)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  
  uVar6 = haystack.content.size_;
  uVar2 = needle.content.size_;
  if (uVar2 - 1 <= uVar6 - 1) {
    uVar3 = uVar6 - uVar2;
    bVar5 = false;
    uVar4 = 0;
    do {
      if ((uVar2 <= uVar6) &&
         (iVar1 = bcmp(haystack.content.ptr + uVar4,needle.content.ptr,uVar2 - 1), iVar1 == 0)) {
        if (bVar5) {
          return false;
        }
        return true;
      }
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 - 1;
      bVar5 = uVar3 < uVar4;
    } while (uVar4 <= uVar3);
  }
  return false;
}

Assistant:

bool hasSubstring(StringPtr haystack, StringPtr needle) {
  // TODO(perf): This is not the best algorithm for substring matching.
  if (needle.size() <= haystack.size()) {
    for (size_t i = 0; i <= haystack.size() - needle.size(); i++) {
      if (haystack.slice(i).startsWith(needle)) {
        return true;
      }
    }
  }
  return false;
}